

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

ExprPtr __thiscall
mathiu::impl::
set<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>
          (impl *this,shared_ptr<const_mathiu::impl::Expr> *lst,
          shared_ptr<const_mathiu::impl::Expr> *lst_1,shared_ptr<const_mathiu::impl::Expr> *lst_2)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  undefined8 *puVar3;
  size_t *psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  long lVar6;
  ExprPtr EVar7;
  initializer_list<std::shared_ptr<const_mathiu::impl::Expr>_> __l;
  undefined8 uStack_78;
  shared_ptr<const_mathiu::impl::Expr> local_70;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_40;
  
  local_70.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (lst->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (lst->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_70.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_70.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_70.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_70.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_70.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_60 = (lst_1->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  local_58 = (lst_1->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_58->_M_use_count = local_58->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_58->_M_use_count = local_58->_M_use_count + 1;
    }
  }
  local_50 = (lst_2->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  local_48 = (lst_2->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_48->_M_use_count = local_48->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_48->_M_use_count = local_48->_M_use_count + 1;
    }
  }
  __l._M_len = 3;
  __l._M_array = &local_70;
  std::
  set<std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::set((set<std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
         *)&local_40,__l,(ExprPtrLess *)((long)&uStack_78 + 7),
        (allocator_type *)((long)&uStack_78 + 6));
  *(undefined8 *)this = 0;
  puVar3 = (undefined8 *)operator_new(0x50);
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_00253718;
  p_Var1 = (_Base_ptr)(puVar3 + 3);
  if (local_40._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    *(undefined4 *)(puVar3 + 3) = 0;
    puVar3[4] = 0;
    puVar3[5] = p_Var1;
    puVar3[6] = p_Var1;
    psVar4 = puVar3 + 7;
  }
  else {
    p_Var2 = &local_40._M_impl.super__Rb_tree_header;
    *(_Rb_tree_color *)(puVar3 + 3) = local_40._M_impl.super__Rb_tree_header._M_header._M_color;
    puVar3[4] = local_40._M_impl.super__Rb_tree_header._M_header._M_parent;
    puVar3[5] = local_40._M_impl.super__Rb_tree_header._M_header._M_left;
    puVar3[6] = local_40._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_40._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var1;
    psVar4 = &local_40._M_impl.super__Rb_tree_header._M_node_count;
    puVar3[7] = local_40._M_impl.super__Rb_tree_header._M_node_count;
    local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_40._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_40._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  *psVar4 = 0;
  *(undefined1 *)(puVar3 + 9) = 0xd;
  *(undefined8 **)(this + 8) = puVar3;
  *(undefined8 **)this = puVar3 + 2;
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Rb_tree(&local_40);
  lVar6 = 0x30;
  _Var5._M_pi = extraout_RDX;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_78 + lVar6) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_78 + lVar6));
      _Var5._M_pi = extraout_RDX_00;
    }
    lVar6 = lVar6 + -0x10;
  } while (lVar6 != 0);
  EVar7.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  EVar7.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ExprPtr)EVar7.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline ExprPtr set(Ts &&... lst)
        {
            return makeSharedExprPtr(Set{{lst...}});
        }